

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<__11,int&>&,__11,int&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [45],
               DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
               *params_1,anon_enum_32 *params_2,int *params_3)

{
  undefined4 in_register_00000014;
  DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
  *params_00;
  anon_enum_32 *params_01;
  int *params_02;
  long lVar1;
  undefined4 in_register_00000034;
  String argValues [4];
  
  str<char_const(&)[45]>
            (argValues,(kj *)"failed: expected (SI_USER) == (info.si_code)",
             (char (*) [45])CONCAT44(in_register_00000014,severity));
  str<kj::_::DebugComparison<__11,int&>&>
            (argValues + 1,(kj *)CONCAT44(in_register_00000034,line),params_00);
  str<__11&>(argValues + 2,(kj *)CONCAT44(in_register_00000014,severity),params_01);
  str<int&>(argValues + 3,(kj *)macroArgs,params_02);
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,0x3e5b8a,(char *)argValues,
              (ArrayPtr<kj::String>)argValues[0].content._0_16_);
  lVar1 = 0x48;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}